

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__do_zlib(stbi__zbuf *a,char *obuf,int olen,int exp,int parse_header)

{
  stbi__zhuffman *z;
  uint uVar1;
  byte *pbVar2;
  stbi_uc *psVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  ushort uVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  int iVar12;
  stbi_uc *psVar13;
  stbi_uc sVar14;
  byte *pbVar15;
  byte *pbVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  stbi__uint32 sVar20;
  stbi__uint32 sVar21;
  uint uVar22;
  char *pcVar23;
  int iVar24;
  ulong uVar25;
  char *pcVar26;
  long *in_FS_OFFSET;
  stbi_uc lencodes [455];
  stbi__zhuffman z_codelength;
  undefined8 local_a08;
  undefined7 uStack_a00;
  undefined4 uStack_9f9;
  byte bStack_9e9;
  stbi_uc local_9e8 [468];
  stbi__zhuffman local_814;
  
  a->zout_start = obuf;
  a->zout = obuf;
  a->zout_end = obuf + olen;
  a->z_expandable = exp;
  if (parse_header == 0) {
LAB_0014bf43:
    a->num_bits = 0;
    a->hit_zeof_once = 0;
    a->code_buffer = 0;
    z = &a->z_distance;
    iVar12 = 0;
    do {
      if (iVar12 < 1) {
        stbi__fill_bits(a);
        iVar12 = a->num_bits;
      }
      uVar1 = a->code_buffer;
      sVar20 = uVar1 >> 1;
      a->code_buffer = sVar20;
      iVar6 = iVar12 + -1;
      a->num_bits = iVar6;
      if (iVar12 < 3) {
        stbi__fill_bits(a);
        iVar6 = a->num_bits;
        sVar20 = a->code_buffer;
      }
      sVar21 = sVar20 >> 2;
      a->code_buffer = sVar21;
      uVar5 = iVar6 - 2;
      a->num_bits = uVar5;
      switch(sVar20 & 3) {
      case 0:
        uVar9 = uVar5 & 7;
        if (uVar9 != 0) {
          if (iVar6 < 2) {
            stbi__fill_bits(a);
            uVar5 = a->num_bits;
            sVar21 = a->code_buffer;
          }
          sVar21 = sVar21 >> (sbyte)uVar9;
          a->code_buffer = sVar21;
          uVar5 = uVar5 - uVar9;
          a->num_bits = uVar5;
        }
        if (0 < (int)uVar5) {
          uVar9 = uVar5 - 1 >> 3;
          uVar25 = (ulong)(uVar9 + 1);
          uVar17 = 0xffffffffffffffff;
          do {
            *(char *)((long)local_814.fast + uVar17 + 1) = (char)sVar21;
            sVar21 = sVar21 >> 8;
            uVar17 = uVar17 + 1;
          } while (uVar9 != uVar17);
          iVar12 = uVar5 - (uVar5 - 1 & 0xfffffff8);
          a->code_buffer = sVar21;
          a->num_bits = iVar12 + -8;
          if (iVar12 == 8) {
            if (uVar17 < 3) goto LAB_0014c7ca;
            goto LAB_0014c7f8;
          }
LAB_0014c8fd:
          pcVar23 = "zlib corrupt";
LAB_0014c914:
          *(char **)(*in_FS_OFFSET + -0x20) = pcVar23;
          return 0;
        }
        if ((int)uVar5 < 0) goto LAB_0014c8fd;
        uVar25 = 0;
LAB_0014c7ca:
        psVar13 = a->zbuffer;
        psVar3 = a->zbuffer_end;
        do {
          if (psVar13 < psVar3) {
            a->zbuffer = psVar13 + 1;
            sVar14 = *psVar13;
            psVar13 = psVar13 + 1;
          }
          else {
            sVar14 = '\0';
          }
          *(stbi_uc *)((long)local_814.fast + uVar25) = sVar14;
          uVar25 = uVar25 + 1;
        } while (uVar25 != 4);
LAB_0014c7f8:
        if ((local_814.fast[1] ^ local_814.fast[0]) != 0xffff) goto LAB_0014c8fd;
        psVar13 = a->zbuffer;
        uVar25 = (ulong)local_814.fast[0];
        if (a->zbuffer_end < psVar13 + uVar25) {
          pcVar23 = "read past buffer";
          goto LAB_0014c914;
        }
        pcVar23 = a->zout;
        if (a->zout_end < pcVar23 + uVar25) {
          iVar12 = stbi__zexpand(a,pcVar23,(uint)local_814.fast[0]);
          if (iVar12 == 0) {
            return 0;
          }
          psVar13 = a->zbuffer;
          pcVar23 = a->zout;
        }
        memcpy(pcVar23,psVar13,uVar25);
        a->zbuffer = a->zbuffer + uVar25;
        a->zout = a->zout + uVar25;
        goto LAB_0014c863;
      case 1:
        iVar12 = stbi__zbuild_huffman
                           (&a->z_length,
                            "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\b\b\b\b\b\b\b\b"
                            ,0x120);
        if (iVar12 == 0) {
          return 0;
        }
        iVar12 = stbi__zbuild_huffman
                           (z,
                            "\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05"
                            ,0x20);
        break;
      case 2:
        if (iVar6 < 7) {
          stbi__fill_bits(a);
          uVar5 = a->num_bits;
          sVar21 = a->code_buffer;
        }
        sVar20 = sVar21 >> 5;
        a->code_buffer = sVar20;
        iVar12 = uVar5 - 5;
        a->num_bits = iVar12;
        if ((int)uVar5 < 10) {
          stbi__fill_bits(a);
          iVar12 = a->num_bits;
          sVar20 = a->code_buffer;
        }
        uVar5 = sVar20 >> 5;
        a->code_buffer = uVar5;
        iVar6 = iVar12 + -5;
        a->num_bits = iVar6;
        if (iVar12 < 9) {
          stbi__fill_bits(a);
          iVar6 = a->num_bits;
          uVar5 = a->code_buffer;
        }
        uVar22 = (sVar21 & 0x1f) + 0x101;
        iVar12 = (sVar20 & 0x1f) + 1;
        uVar9 = uVar5 >> 4;
        a->code_buffer = uVar9;
        iVar6 = iVar6 + -4;
        a->num_bits = iVar6;
        local_a08 = 0;
        uStack_a00 = 0;
        uStack_9f9 = 0;
        uVar25 = 0;
        do {
          uVar10 = uVar9;
          if (iVar6 < 3) {
            stbi__fill_bits(a);
            iVar6 = a->num_bits;
            uVar10 = a->code_buffer;
          }
          uVar9 = uVar10 >> 3;
          a->code_buffer = uVar9;
          iVar6 = iVar6 + -3;
          a->num_bits = iVar6;
          *(byte *)((long)&local_a08 +
                   (ulong)(byte)(&stbi__compute_huffman_codes(stbi__zbuf*)::length_dezigzag)[uVar25]
                   ) = (byte)uVar10 & 7;
          uVar25 = uVar25 + 1;
        } while ((uVar5 & 0xf) + 4 != uVar25);
        iVar6 = stbi__zbuild_huffman(&local_814,(stbi_uc *)&local_a08,0x13);
        if (iVar6 == 0) {
          return 0;
        }
        iVar7 = iVar12 + uVar22;
        iVar6 = a->num_bits;
        iVar24 = 0;
        do {
          if (iVar6 < 0x10) {
            if (a->zbuffer < a->zbuffer_end) {
              stbi__fill_bits(a);
            }
            else {
              if (a->hit_zeof_once != 0) goto LAB_0014c88e;
              a->hit_zeof_once = 1;
              a->num_bits = iVar6 + 0x10;
            }
          }
          uVar5 = a->code_buffer;
          uVar8 = local_814.fast[uVar5 & 0x1ff];
          if (uVar8 == 0) {
            uVar8 = (ushort)uVar5 << 8 | (ushort)uVar5 >> 8;
            uVar9 = (uVar8 & 0xf0f) << 4 | (uVar8 & 0xf0f0) >> 4;
            uVar9 = (uVar9 >> 2 & 0x3333) + (uVar9 & 0x3333) * 4;
            uVar9 = (uVar9 >> 1 & 0x5555) + (uVar9 & 0x5555) * 2;
            lVar11 = 0;
            do {
              lVar18 = lVar11;
              lVar11 = lVar18 + 1;
            } while (local_814.maxcode[lVar18 + 10] <= (int)uVar9);
            if (((0xf < lVar18 + 10U) ||
                (lVar19 = (ulong)local_814.firstsymbol[lVar18 + 10] +
                          ((ulong)(uVar9 >> (7U - (char)lVar11 & 0x1f)) -
                          (ulong)local_814.firstcode[lVar18 + 10]), 0x11f < (int)lVar19)) ||
               ((ulong)*(byte *)((long)&local_814 + lVar19 + 0x484) - 9 != lVar11))
            goto LAB_0014c88e;
            uVar5 = uVar5 >> ((byte)(lVar18 + 10U) & 0x1f);
            a->code_buffer = uVar5;
            iVar6 = (a->num_bits - (int)lVar11) + -9;
            a->num_bits = iVar6;
            uVar8 = *(ushort *)((long)&local_814 + lVar19 * 2 + 0x5a4);
          }
          else {
            uVar5 = uVar5 >> ((byte)(uVar8 >> 9) & 0x1f);
            a->code_buffer = uVar5;
            iVar6 = a->num_bits - (uint)(uVar8 >> 9);
            a->num_bits = iVar6;
            uVar8 = uVar8 & 0x1ff;
          }
          if (0x12 < uVar8) goto LAB_0014c88e;
          if (uVar8 < 0x10) {
            lVar11 = (long)iVar24;
            iVar24 = iVar24 + 1;
            local_9e8[lVar11] = (char)uVar8;
          }
          else {
            if (uVar8 == 0x11) {
              if (iVar6 < 3) {
                stbi__fill_bits(a);
                iVar6 = a->num_bits;
                uVar5 = a->code_buffer;
              }
              a->code_buffer = uVar5 >> 3;
              iVar6 = iVar6 + -3;
              a->num_bits = iVar6;
              uVar5 = (uVar5 & 7) + 3;
LAB_0014c73a:
              bVar4 = 0;
            }
            else {
              if (uVar8 != 0x10) {
                if (iVar6 < 7) {
                  stbi__fill_bits(a);
                  iVar6 = a->num_bits;
                  uVar5 = a->code_buffer;
                }
                a->code_buffer = uVar5 >> 7;
                iVar6 = iVar6 + -7;
                a->num_bits = iVar6;
                uVar5 = (uVar5 & 0x7f) + 0xb;
                goto LAB_0014c73a;
              }
              if (iVar6 < 2) {
                stbi__fill_bits(a);
                iVar6 = a->num_bits;
                uVar5 = a->code_buffer;
              }
              a->code_buffer = uVar5 >> 2;
              iVar6 = iVar6 + -2;
              a->num_bits = iVar6;
              if (iVar24 == 0) goto LAB_0014c88e;
              uVar5 = (uVar5 & 3) + 3;
              bVar4 = (&bStack_9e9)[iVar24];
            }
            if (iVar7 - iVar24 < (int)uVar5) goto LAB_0014c88e;
            memset(local_9e8 + iVar24,(uint)bVar4,(ulong)uVar5);
            iVar24 = iVar24 + uVar5;
          }
        } while (iVar24 < iVar7);
        if (iVar24 != iVar7) {
LAB_0014c88e:
          *(char **)(*in_FS_OFFSET + -0x20) = "bad codelengths";
          return 0;
        }
        iVar6 = stbi__zbuild_huffman(&a->z_length,local_9e8,uVar22);
        if (iVar6 == 0) {
          return 0;
        }
        iVar12 = stbi__zbuild_huffman(z,local_9e8 + uVar22,iVar12);
        break;
      case 3:
        goto LAB_0014c8eb;
      }
      if (iVar12 == 0) {
        return 0;
      }
      pcVar26 = "bad huffman code";
      pcVar23 = a->zout;
      while( true ) {
        while( true ) {
          if (a->num_bits < 0x10) {
            if (a->zbuffer < a->zbuffer_end) {
              stbi__fill_bits(a);
            }
            else {
              if (a->hit_zeof_once != 0) goto LAB_0014c8d6;
              a->hit_zeof_once = 1;
              a->num_bits = a->num_bits + 0x10;
            }
          }
          uVar5 = a->code_buffer;
          uVar8 = (a->z_length).fast[uVar5 & 0x1ff];
          if (uVar8 == 0) {
            uVar8 = (ushort)uVar5 << 8 | (ushort)uVar5 >> 8;
            uVar9 = (uVar8 & 0xf0f) << 4 | (uVar8 & 0xf0f0) >> 4;
            uVar9 = (uVar9 >> 2 & 0x3333) + (uVar9 & 0x3333) * 4;
            uVar9 = (uVar9 >> 1 & 0x5555) + (uVar9 & 0x5555) * 2;
            lVar11 = 0;
            do {
              lVar18 = lVar11;
              lVar11 = lVar18 + 1;
            } while ((a->z_length).maxcode[lVar18 + 10] <= (int)uVar9);
            if (((0xf < lVar18 + 10U) ||
                (lVar19 = (ulong)(a->z_length).firstsymbol[lVar18 + 10] +
                          ((ulong)(uVar9 >> (7U - (char)lVar11 & 0x1f)) -
                          (ulong)(a->z_length).firstcode[lVar18 + 10]), 0x11f < (int)lVar19)) ||
               ((ulong)*(byte *)((long)a + lVar19 + 0x4c0) - 9 != lVar11)) goto LAB_0014c8d6;
            uVar5 = uVar5 >> ((byte)(lVar18 + 10U) & 0x1f);
            a->code_buffer = uVar5;
            iVar12 = (a->num_bits - (int)lVar11) + -9;
            a->num_bits = iVar12;
            uVar9 = (uint)*(ushort *)((long)a + lVar19 * 2 + 0x5e0);
          }
          else {
            uVar5 = uVar5 >> ((byte)(uVar8 >> 9) & 0x1f);
            a->code_buffer = uVar5;
            iVar12 = a->num_bits - (uint)(uVar8 >> 9);
            a->num_bits = iVar12;
            uVar9 = uVar8 & 0x1ff;
          }
          if (0xff < uVar9) break;
          if (a->zout_end <= pcVar23) {
            iVar12 = stbi__zexpand(a,pcVar23,1);
            if (iVar12 == 0) {
              return 0;
            }
            pcVar23 = a->zout;
          }
          *pcVar23 = (char)uVar9;
          pcVar23 = pcVar23 + 1;
        }
        if (uVar9 == 0x100) break;
        if (0x11d < uVar9) goto LAB_0014c8d6;
        uVar25 = (ulong)(uVar9 - 0x101);
        uVar9 = stbi__zlength_base[uVar25];
        if (0xffffffffffffffeb < uVar25 - 0x1c) {
          iVar6 = stbi__zlength_extra[uVar25];
          if (iVar12 < iVar6) {
            stbi__fill_bits(a);
            iVar12 = a->num_bits;
            uVar5 = a->code_buffer;
          }
          uVar22 = ~(-1 << ((byte)iVar6 & 0x1f)) & uVar5;
          uVar5 = uVar5 >> ((byte)iVar6 & 0x1f);
          a->code_buffer = uVar5;
          iVar12 = iVar12 - iVar6;
          a->num_bits = iVar12;
          uVar9 = uVar9 + uVar22;
        }
        if (iVar12 < 0x10) {
          if (a->zbuffer < a->zbuffer_end) {
            stbi__fill_bits(a);
            uVar5 = a->code_buffer;
          }
          else {
            if (a->hit_zeof_once != 0) goto LAB_0014c8d6;
            a->hit_zeof_once = 1;
            a->num_bits = iVar12 + 0x10;
          }
        }
        uVar8 = z->fast[uVar5 & 0x1ff];
        if (uVar8 == 0) {
          uVar8 = (ushort)uVar5 << 8 | (ushort)uVar5 >> 8;
          uVar22 = (uVar8 & 0xf0f) << 4 | (uVar8 & 0xf0f0) >> 4;
          uVar22 = (uVar22 >> 2 & 0x3333) + (uVar22 & 0x3333) * 4;
          uVar22 = (uVar22 >> 1 & 0x5555) + (uVar22 & 0x5555) * 2;
          lVar11 = 0;
          do {
            lVar18 = lVar11;
            lVar11 = lVar18 + 1;
          } while ((a->z_distance).maxcode[lVar18 + 10] <= (int)uVar22);
          if (((0xf < lVar18 + 10U) ||
              (lVar19 = (ulong)(a->z_distance).firstsymbol[lVar18 + 10] +
                        ((ulong)(uVar22 >> (7U - (char)lVar11 & 0x1f)) -
                        (ulong)(a->z_distance).firstcode[lVar18 + 10]), 0x11f < (int)lVar19)) ||
             ((ulong)*(byte *)((long)a + lVar19 + 0xca4) - 9 != lVar11)) goto LAB_0014c8d6;
          uVar5 = uVar5 >> ((byte)(lVar18 + 10U) & 0x1f);
          a->code_buffer = uVar5;
          iVar12 = (a->num_bits - (int)lVar11) + -9;
          a->num_bits = iVar12;
          uVar22 = (uint)*(ushort *)((long)a + lVar19 * 2 + 0xdc4);
        }
        else {
          uVar5 = uVar5 >> ((byte)(uVar8 >> 9) & 0x1f);
          a->code_buffer = uVar5;
          iVar12 = a->num_bits - (uint)(uVar8 >> 9);
          a->num_bits = iVar12;
          uVar22 = uVar8 & 0x1ff;
        }
        if (0x1d < uVar22) goto LAB_0014c8d6;
        iVar6 = stbi__zdist_base[uVar22];
        if (3 < uVar22) {
          iVar7 = stbi__zdist_extra[uVar22];
          if (iVar12 < iVar7) {
            stbi__fill_bits(a);
            iVar12 = a->num_bits;
            uVar5 = a->code_buffer;
          }
          a->code_buffer = uVar5 >> ((byte)iVar7 & 0x1f);
          a->num_bits = iVar12 - iVar7;
          iVar6 = iVar6 + (~(-1 << ((byte)iVar7 & 0x1f)) & uVar5);
        }
        if ((long)pcVar23 - (long)a->zout_start < (long)iVar6) {
          pcVar26 = "bad dist";
          goto LAB_0014c8d6;
        }
        if ((long)a->zout_end - (long)pcVar23 < (long)(int)uVar9) {
          iVar12 = stbi__zexpand(a,pcVar23,uVar9);
          if (iVar12 == 0) {
            return 0;
          }
          pcVar23 = a->zout;
        }
        lVar11 = -(long)iVar6;
        if (iVar6 == 1) {
          if (uVar9 != 0) {
            memset(pcVar23,(uint)(byte)pcVar23[lVar11],(ulong)uVar9);
            pcVar23 = pcVar23 + (ulong)(uVar9 - 1) + 1;
          }
        }
        else {
          for (; uVar9 != 0; uVar9 = uVar9 - 1) {
            *pcVar23 = pcVar23[lVar11];
            pcVar23 = pcVar23 + 1;
          }
        }
      }
      a->zout = pcVar23;
      if ((a->hit_zeof_once != 0) && (iVar12 < 0x10)) {
        pcVar26 = "unexpected end";
LAB_0014c8d6:
        *(char **)(*in_FS_OFFSET + -0x20) = pcVar26;
        return 0;
      }
LAB_0014c863:
      if ((uVar1 & 1) != 0) {
        return 1;
      }
      iVar12 = a->num_bits;
    } while( true );
  }
  pbVar15 = a->zbuffer;
  pbVar2 = a->zbuffer_end;
  uVar8 = 0;
  if (pbVar15 < pbVar2) {
    a->zbuffer = pbVar15 + 1;
    bVar4 = *pbVar15;
    pbVar15 = pbVar15 + 1;
  }
  else {
    bVar4 = 0;
  }
  pbVar16 = pbVar15;
  if (pbVar15 < pbVar2) {
    pbVar16 = pbVar15 + 1;
    a->zbuffer = pbVar16;
    uVar8 = (ushort)*pbVar15;
  }
  pcVar23 = "bad zlib header";
  if ((pbVar16 < pbVar2) && ((ushort)(((ushort)bVar4 << 8 | uVar8) * 0x7bdf) < 0x843)) {
    if ((uVar8 & 0x20) == 0) {
      if ((bVar4 & 0xf) == 8) goto LAB_0014bf43;
      pcVar23 = "bad compression";
    }
    else {
      pcVar23 = "no preset dict";
    }
  }
  *(char **)(*in_FS_OFFSET + -0x20) = pcVar23;
LAB_0014c8eb:
  return 0;
}

Assistant:

static int stbi__do_zlib(stbi__zbuf *a, char *obuf, int olen, int exp, int parse_header)
{
   a->zout_start = obuf;
   a->zout       = obuf;
   a->zout_end   = obuf + olen;
   a->z_expandable = exp;

   return stbi__parse_zlib(a, parse_header);
}